

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O1

ArrayIDIDFunc *
compute_tree_depth_order<main::__0>
          (ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,
          anon_class_8_1_f6d195b4 *compute_separator,int tree_depth_must_be_below)

{
  uint arc_end;
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ArrayIDIDFunc *o;
  bool bVar6;
  int *piVar7;
  void *__s;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int order_end;
  ArrayIDIDFunc to_input_id;
  int local_e0;
  int local_dc;
  ArrayIDFunc<int> local_d8;
  int local_c8;
  ArrayIDIDFunc *local_c0;
  ulong local_b8;
  ArrayIDIDFunc local_b0;
  ArrayIDIDFunc local_98;
  long local_80;
  ArrayIDIDFunc *local_78;
  anon_class_32_4_d72f82c3 local_70;
  anon_class_32_4_cb35006c local_50;
  
  iVar11 = tail->image_count_;
  lVar12 = (long)iVar11;
  (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = iVar11;
  local_dc = tree_depth_must_be_below;
  if (lVar12 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar10 = lVar12 * 4;
    }
    piVar7 = (int *)operator_new__(uVar10);
  }
  (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar7;
  __return_storage_ptr__->image_count_ = iVar11;
  local_e0 = 0;
  local_c0 = __return_storage_ptr__;
  local_b0.super_ArrayIDFunc<int>.preimage_count_ = iVar11;
  if (iVar11 == 0) {
    local_b0.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar10 = lVar12 * 4;
    }
    local_b0.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar10);
  }
  if (0 < iVar11) {
    auVar17 = vpbroadcastq_avx512vl();
    auVar4 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    lVar9 = 0;
    auVar18._8_8_ = 8;
    auVar18._0_8_ = 8;
    auVar18._16_8_ = 8;
    auVar18._24_8_ = 8;
    auVar20._8_4_ = 8;
    auVar20._0_8_ = 0x800000008;
    auVar20._12_4_ = 8;
    auVar20._16_4_ = 8;
    auVar20._20_4_ = 8;
    auVar20._24_4_ = 8;
    auVar20._28_4_ = 8;
    do {
      vpcmpuq_avx512vl(auVar5,auVar17,2);
      vpcmpuq_avx512vl(auVar4,auVar17,2);
      auVar19 = vmovdqu32_avx512vl(auVar3);
      *(undefined1 (*) [32])((long)local_b0.super_ArrayIDFunc<int>.data_ + lVar9) = auVar19;
      auVar5 = vpaddq_avx2(auVar5,auVar18);
      auVar4 = vpaddq_avx2(auVar4,auVar18);
      auVar3 = vpaddd_avx2(auVar3,auVar20);
      lVar9 = lVar9 + 0x20;
    } while ((ulong)(iVar11 + 7U >> 3) << 5 != lVar9);
  }
  local_b0.image_count_ = iVar11;
  inplace_reorder_nodes_and_arc_in_preorder(tail,head,&local_b0);
  local_98.super_ArrayIDFunc<int>.preimage_count_ = iVar11;
  if (iVar11 == 0) {
    local_98.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar10 = lVar12 * 4;
    }
    local_98.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar10);
  }
  if (0 < iVar11) {
    auVar17 = vpbroadcastq_avx512vl();
    auVar4 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    lVar12 = 0;
    auVar19._8_8_ = 8;
    auVar19._0_8_ = 8;
    auVar19._16_8_ = 8;
    auVar19._24_8_ = 8;
    auVar21._8_4_ = 8;
    auVar21._0_8_ = 0x800000008;
    auVar21._12_4_ = 8;
    auVar21._16_4_ = 8;
    auVar21._20_4_ = 8;
    auVar21._24_4_ = 8;
    auVar21._28_4_ = 8;
    do {
      vpcmpuq_avx512vl(auVar5,auVar17,2);
      vpcmpuq_avx512vl(auVar4,auVar17,2);
      auVar18 = vmovdqu32_avx512vl(auVar3);
      *(undefined1 (*) [32])((long)local_98.super_ArrayIDFunc<int>.data_ + lVar12) = auVar18;
      auVar5 = vpaddq_avx2(auVar5,auVar19);
      auVar4 = vpaddq_avx2(auVar4,auVar19);
      auVar3 = vpaddd_avx2(auVar3,auVar21);
      lVar12 = lVar12 + 0x20;
    } while ((ulong)(iVar11 + 7U >> 3) << 5 != lVar12);
  }
  local_50.tree_depth_must_be_below = &local_dc;
  local_50.order_end = &local_e0;
  arc_end = (tail->super_ArrayIDFunc<int>).preimage_count_;
  uVar14 = tail->image_count_;
  local_b8 = (ulong)uVar14;
  uVar13 = uVar14 + 0x7e;
  uVar8 = uVar14 + 0x3f;
  if ((int)(uVar14 + 0x3f) < 0) {
    uVar8 = uVar13;
  }
  local_98.image_count_ = iVar11;
  local_50.compute_separator = (FastComputeSeparator *)compute_separator;
  local_50.order = __return_storage_ptr__;
  if (uVar13 < 0x7f) {
    __s = (void *)0x0;
  }
  else {
    uVar10 = 0xffffffffffffffff;
    if (-0x7f < (int)uVar14) {
      uVar10 = (long)((int)uVar8 >> 6) << 3;
    }
    __s = operator_new__(uVar10);
  }
  if (0x7e < uVar13) {
    memset(__s,0xff,(long)((int)uVar8 >> 6) << 3);
  }
  if (0 < (int)arc_end) {
    piVar7 = (head->super_ArrayIDFunc<int>).data_;
    piVar1 = (tail->super_ArrayIDFunc<int>).data_;
    uVar10 = 0;
    do {
      uVar14 = piVar1[uVar10];
      if (piVar7[uVar10] < (int)uVar14) {
        uVar8 = uVar14 + 0x3f;
        if (-1 < (int)uVar14) {
          uVar8 = uVar14;
        }
        uVar16 = *(ulong *)((long)__s + (long)((int)uVar8 >> 6) * 8);
        *(ulong *)((long)__s + (long)((int)uVar8 >> 6) * 8) =
             (ulong)((uint)(uVar16 >> ((ulong)uVar14 & 0x3f)) & 1) << ((ulong)uVar14 & 0x3f) ^
             uVar16;
      }
      uVar10 = uVar10 + 1;
    } while (arc_end != uVar10);
  }
  local_70.input_node_id = &local_98;
  local_70.callback = &local_50;
  iVar11 = 0;
  uVar14 = 0;
  uVar8 = (uint)local_b8;
  bVar2 = 1 < (int)uVar8;
  local_78 = tail;
  local_70.tail = tail;
  local_70.head = head;
  if (1 < (int)uVar8) {
    local_80 = (long)(int)arc_end;
    uVar14 = 0;
    uVar16 = 1;
    bVar2 = true;
    iVar11 = 0;
    uVar10 = local_b8;
    do {
      iVar15 = (int)uVar16;
      if ((*(ulong *)((long)__s + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) != 0) {
        uVar8 = uVar14;
        if ((int)uVar14 < (int)arc_end) {
          lVar12 = 0;
          do {
            if (iVar15 <= (local_78->super_ArrayIDFunc<int>).data_[(int)uVar14 + lVar12]) {
              uVar8 = (int)lVar12 + uVar14;
              break;
            }
            lVar12 = lVar12 + 1;
            uVar8 = arc_end;
          } while (local_80 - (int)uVar14 != lVar12);
        }
        bVar6 = forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:396:9)>
                ::anon_class_32_4_d72f82c3::operator()(&local_70,iVar11,iVar15,uVar14,uVar8);
        if (bVar6) {
          uVar14 = uVar8;
          iVar11 = iVar15;
        }
        uVar8 = (uint)local_b8;
        uVar10 = local_b8;
        if (!bVar6) break;
      }
      uVar13 = iVar15 + 1;
      uVar16 = (ulong)uVar13;
      uVar8 = (uint)uVar10;
      bVar2 = (int)uVar13 < (int)uVar8;
    } while (uVar13 != uVar8);
  }
  if (!bVar2) {
    forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:396:9)>
    ::anon_class_32_4_d72f82c3::operator()(&local_70,iVar11,uVar8,uVar14,arc_end);
  }
  o = local_c0;
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  if (local_98.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_98.super_ArrayIDFunc<int>.data_);
  }
  if ((o->super_ArrayIDFunc<int>).preimage_count_ != 0) {
    ArrayIDFunc<int>::ArrayIDFunc(&local_d8,&o->super_ArrayIDFunc<int>);
    iVar15 = local_b0.image_count_;
    piVar7 = local_d8.data_;
    iVar11 = local_d8.preimage_count_;
    if (0 < local_d8.preimage_count_) {
      lVar12 = 0;
      do {
        local_d8.data_[lVar12] = local_b0.super_ArrayIDFunc<int>.data_[local_d8.data_[lVar12]];
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_d8.preimage_count_);
    }
    local_c8 = local_b0.image_count_;
    local_d8.preimage_count_ = 0;
    local_d8.data_ = (int *)0x0;
    piVar1 = (o->super_ArrayIDFunc<int>).data_;
    if (piVar1 != (int *)0x0) {
      operator_delete__(piVar1);
    }
    (o->super_ArrayIDFunc<int>).preimage_count_ = iVar11;
    (o->super_ArrayIDFunc<int>).data_ = piVar7;
    o->image_count_ = iVar15;
    if (local_d8.data_ != (int *)0x0) {
      operator_delete__(local_d8.data_);
    }
  }
  if (local_b0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_b0.super_ArrayIDFunc<int>.data_);
  }
  return o;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    (void)arc_count;

    ArrayIDIDFunc order(node_count, node_count);
    int order_end = 0;

    ArrayIDIDFunc to_input_id = identity_permutation(node_count);
    inplace_reorder_nodes_and_arc_in_preorder(tail, head, to_input_id);
    forall_connected_components_with_nodes_and_arcs_in_preorder(
        tail, head, identity_permutation(node_count),
        [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head,
            ArrayIDIDFunc sub_to_super) {
            int sub_node_count = sub_tail.image_count();
            ArrayIDIDFunc sub_order = compute_tree_depth_order_of_connected_graph(
                std::move(sub_tail), std::move(sub_head), compute_separator,
                tree_depth_must_be_below);
            if(sub_order.preimage_count() != 0){
                for (int i = 0; i < sub_node_count; ++i)
                    order[order_end++] = sub_to_super[sub_order[i]];
                return true;
            }else{
                order = ArrayIDIDFunc();
                return false;
            }
        });
    if(order.preimage_count() != 0){
        assert(order_end == node_count);
        order = chain(order, to_input_id);
    }
    return order;
}